

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall helics::TimeCoordinator::updateTimeGrant(TimeCoordinator *this)

{
  int32_t *piVar1;
  uint uVar2;
  baseType bVar3;
  ActionMessage treq;
  ActionMessage AStack_c8;
  
  if (this->iterating != FORCE_ITERATION) {
    bVar3 = (this->time_exec).internalTimeCode;
    (this->time_granted).internalTimeCode = bVar3;
    (this->time_grantBase).internalTimeCode = bVar3;
  }
  piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
  *piVar1 = *piVar1 + 1;
  ActionMessage::ActionMessage(&AStack_c8,cmd_time_grant);
  AStack_c8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  AStack_c8.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
  uVar2 = (this->super_BaseTimeCoordinator).sequenceCounter;
  AStack_c8.counter = (uint16_t)uVar2;
  if (0xffff < uVar2) {
    (this->super_BaseTimeCoordinator).sequenceCounter = 0;
  }
  if (this->iterating != NO_ITERATIONS) {
    TimeDependencies::resetIteratingTimeRequests
              (&(this->super_BaseTimeCoordinator).dependencies,
               (Time)(this->time_exec).internalTimeCode);
  }
  (this->lastSend).next.internalTimeCode = AStack_c8.actionTime.internalTimeCode;
  (this->lastSend).Te.internalTimeCode = AStack_c8.actionTime.internalTimeCode;
  (this->lastSend).minDe.internalTimeCode = AStack_c8.actionTime.internalTimeCode;
  (this->lastSend).mTimeState = time_granted;
  transmitTimingMessages(this,&AStack_c8,(GlobalFederateId)0x8831d580);
  ActionMessage::~ActionMessage(&AStack_c8);
  return;
}

Assistant:

void TimeCoordinator::updateTimeGrant()
{
    if (iterating != IterationRequest::FORCE_ITERATION) {
        time_granted = time_exec;
        time_grantBase = time_granted;
    }
    ++sequenceCounter;
    ActionMessage treq(CMD_TIME_GRANT);
    treq.source_id = mSourceId;
    treq.actionTime = time_granted;
    treq.counter = sequenceCounter;
    if (static_cast<std::int32_t>(treq.counter) != sequenceCounter) {
        sequenceCounter = 0;
    }
    if (iterating != IterationRequest::NO_ITERATIONS) {
        dependencies.resetIteratingTimeRequests(time_exec);
    }
    lastSend.next = treq.actionTime;
    lastSend.Te = treq.actionTime;
    lastSend.minDe = treq.actionTime;
    lastSend.mTimeState = TimeState::time_granted;
    transmitTimingMessages(treq);
    // printf("%d GRANT allow=%f next=%f, exec=%f, Tdemin=%f\n", source_id,
    // static_cast<double>(time_allow), static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}